

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx512::SubGridMBIntersectorKPluecker<4,_8,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  int iVar1;
  undefined4 uVar2;
  BBox1f BVar3;
  ushort uVar4;
  ushort uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  float fVar11;
  float fVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  byte bVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  ulong *puVar23;
  AABBNodeMB4D *node1;
  ulong uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  uint uVar32;
  ulong uVar33;
  Geometry *pGVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  float fVar39;
  float fVar81;
  float fVar82;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar84;
  float fVar85;
  float fVar86;
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  float fVar83;
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  float fVar87;
  vint4 ai;
  undefined1 auVar88 [16];
  vint4 ai_2;
  vint4 bi;
  undefined1 auVar89 [16];
  vint4 ai_6;
  undefined1 auVar90 [16];
  vint4 bi_2;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  vint4 bi_8;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  float fVar116;
  undefined1 auVar115 [32];
  float fVar117;
  float fVar118;
  float fVar119;
  vint4 bi_3;
  undefined1 auVar120 [64];
  vint4 bi_6;
  undefined1 auVar121 [64];
  undefined1 in_ZMM25 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  float old_t;
  RTCFilterFunctionNArguments args;
  vint<8> itime;
  vfloat<8> ftime;
  NodeRef stack [244];
  undefined1 local_cf1;
  ulong *local_cf0;
  ulong local_ce8;
  Geometry *local_ce0;
  ulong local_cd8;
  size_t local_cd0;
  RayK<8> *local_cc8;
  uint local_cc0;
  uint local_cbc;
  ulong local_cb8;
  long local_cb0;
  ulong local_ca8;
  ulong local_ca0;
  long local_c98;
  long local_c90;
  ulong *local_c88;
  ulong local_c80;
  long local_c78;
  long local_c70;
  Scene *local_c68;
  ulong local_c60;
  long local_c58;
  long local_c50;
  ulong local_c48;
  undefined1 local_c40 [32];
  undefined1 local_c10 [16];
  undefined1 local_c00 [16];
  undefined1 local_bf0 [16];
  undefined1 local_be0 [16];
  undefined1 local_bd0 [16];
  undefined1 local_bc0 [16];
  RTCFilterFunctionNArguments local_bb0;
  undefined1 local_b80 [32];
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined1 local_b10 [16];
  undefined1 local_b00 [16];
  float local_af0;
  float fStack_aec;
  float fStack_ae8;
  float fStack_ae4;
  float local_ae0;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  float local_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 *local_a00;
  char local_9f8;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined4 local_920;
  undefined4 uStack_91c;
  undefined4 uStack_918;
  undefined4 uStack_914;
  undefined4 uStack_910;
  undefined4 uStack_90c;
  undefined4 uStack_908;
  undefined4 uStack_904;
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined1 local_860 [32];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_800 = root.ptr;
  auVar40 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar123 = ZEXT1664(auVar40);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar124 = ZEXT1664(auVar40);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x40)));
  auVar125 = ZEXT1664(auVar40);
  fVar87 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar39 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar81 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar40 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar87 * 0.99999964)));
  auVar126 = ZEXT1664(auVar40);
  auVar40 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar39 * 0.99999964)));
  auVar127 = ZEXT1664(auVar40);
  auVar40 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar81 * 0.99999964)));
  auVar128 = ZEXT1664(auVar40);
  fVar87 = fVar87 * 1.0000004;
  fVar39 = fVar39 * 1.0000004;
  fVar81 = fVar81 * 1.0000004;
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_c48 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar30 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar38 = uVar35 ^ 0x10;
  uVar36 = local_c48 ^ 0x10;
  iVar1 = (tray->tnear).field_0.i[k];
  local_b00._4_4_ = iVar1;
  local_b00._0_4_ = iVar1;
  local_b00._8_4_ = iVar1;
  local_b00._12_4_ = iVar1;
  auVar120 = ZEXT1664(local_b00);
  iVar1 = (tray->tfar).field_0.i[k];
  local_b10._4_4_ = iVar1;
  local_b10._0_4_ = iVar1;
  local_b10._8_4_ = iVar1;
  local_b10._12_4_ = iVar1;
  auVar121 = ZEXT1664(local_b10);
  local_ac0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar40 = vxorps_avx512vl(in_ZMM25._0_16_,in_ZMM25._0_16_);
  auVar122 = ZEXT1664(auVar40);
  puVar23 = local_7f8;
  fVar82 = fVar87;
  fVar83 = fVar87;
  fVar84 = fVar87;
  fVar85 = fVar39;
  fVar86 = fVar39;
  fVar116 = fVar39;
  fVar117 = fVar81;
  fVar118 = fVar81;
  fVar119 = fVar81;
  local_cd0 = k;
  local_cc8 = ray;
  local_ca0 = uVar35;
  local_af0 = fVar81;
  fStack_aec = fVar81;
  fStack_ae8 = fVar81;
  fStack_ae4 = fVar81;
  local_ae0 = fVar39;
  fStack_adc = fVar39;
  fStack_ad8 = fVar39;
  fStack_ad4 = fVar39;
  local_ad0 = fVar87;
  fStack_acc = fVar87;
  fStack_ac8 = fVar87;
  fStack_ac4 = fVar87;
LAB_01d65b5a:
  do {
    local_c88 = puVar23;
    if (local_c88 == &local_800) {
LAB_01d66b56:
      return local_c88 != &local_800;
    }
    local_cf0 = local_c88 + -1;
    uVar37 = local_c88[-1];
    while ((uVar37 & 8) == 0) {
      uVar24 = uVar37 & 0xfffffffffffffff0;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar44._4_4_ = uVar2;
      auVar44._0_4_ = uVar2;
      auVar44._8_4_ = uVar2;
      auVar44._12_4_ = uVar2;
      auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar24 + 0x80 + uVar35),auVar44,
                                *(undefined1 (*) [16])(uVar24 + 0x20 + uVar35));
      auVar41 = vsubps_avx512vl(auVar40,auVar123._0_16_);
      auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar24 + 0x80 + local_c48),auVar44,
                                *(undefined1 (*) [16])(uVar24 + 0x20 + local_c48));
      auVar41 = vmulps_avx512vl(auVar126._0_16_,auVar41);
      auVar42 = vsubps_avx512vl(auVar40,auVar124._0_16_);
      auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar24 + 0x80 + uVar30),auVar44,
                                *(undefined1 (*) [16])(uVar24 + 0x20 + uVar30));
      auVar42 = vmulps_avx512vl(auVar127._0_16_,auVar42);
      auVar40 = vsubps_avx512vl(auVar40,auVar125._0_16_);
      auVar40 = vmulps_avx512vl(auVar128._0_16_,auVar40);
      auVar40 = vmaxps_avx(auVar42,auVar40);
      auVar41 = vmaxps_avx(auVar120._0_16_,auVar41);
      auVar40 = vmaxps_avx(auVar41,auVar40);
      auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar24 + 0x80 + uVar38),auVar44,
                                *(undefined1 (*) [16])(uVar24 + 0x20 + uVar38));
      auVar41 = vsubps_avx512vl(auVar41,auVar123._0_16_);
      auVar42._0_4_ = fVar87 * auVar41._0_4_;
      auVar42._4_4_ = fVar82 * auVar41._4_4_;
      auVar42._8_4_ = fVar83 * auVar41._8_4_;
      auVar42._12_4_ = fVar84 * auVar41._12_4_;
      auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar24 + 0x80 + uVar36),auVar44,
                                *(undefined1 (*) [16])(uVar24 + 0x20 + uVar36));
      auVar41 = vsubps_avx512vl(auVar41,auVar124._0_16_);
      auVar90._0_4_ = fVar39 * auVar41._0_4_;
      auVar90._4_4_ = fVar85 * auVar41._4_4_;
      auVar90._8_4_ = fVar86 * auVar41._8_4_;
      auVar90._12_4_ = fVar116 * auVar41._12_4_;
      auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar24 + 0x80 + (uVar30 ^ 0x10)),auVar44,
                                *(undefined1 (*) [16])(uVar24 + 0x20 + (uVar30 ^ 0x10)));
      auVar41 = vsubps_avx512vl(auVar41,auVar125._0_16_);
      auVar45._0_4_ = fVar81 * auVar41._0_4_;
      auVar45._4_4_ = fVar117 * auVar41._4_4_;
      auVar45._8_4_ = fVar118 * auVar41._8_4_;
      auVar45._12_4_ = fVar119 * auVar41._12_4_;
      auVar41 = vminps_avx(auVar90,auVar45);
      auVar42 = vminps_avx(auVar121._0_16_,auVar42);
      auVar41 = vminps_avx(auVar42,auVar41);
      uVar13 = vcmpps_avx512vl(auVar40,auVar41,2);
      uVar32 = (uint)uVar13;
      if (((uint)uVar37 & 7) == 6) {
        uVar14 = vcmpps_avx512vl(auVar44,*(undefined1 (*) [16])(uVar24 + 0xf0),1);
        uVar15 = vcmpps_avx512vl(auVar44,*(undefined1 (*) [16])(uVar24 + 0xe0),0xd);
        uVar32 = (uint)(byte)((byte)uVar14 & (byte)uVar15 & (byte)uVar13);
      }
      puVar23 = local_cf0;
      if ((byte)uVar32 == 0) goto LAB_01d65b5a;
      lVar25 = 0;
      for (uVar37 = (ulong)(byte)uVar32; (uVar37 & 1) == 0;
          uVar37 = uVar37 >> 1 | 0x8000000000000000) {
        lVar25 = lVar25 + 1;
      }
      uVar37 = *(ulong *)(uVar24 + lVar25 * 8);
      uVar32 = (uVar32 & 0xff) - 1 & uVar32 & 0xff;
      uVar33 = (ulong)uVar32;
      if (uVar32 != 0) {
        do {
          *local_cf0 = uVar37;
          local_cf0 = local_cf0 + 1;
          lVar25 = 0;
          for (uVar37 = uVar33; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
            lVar25 = lVar25 + 1;
          }
          uVar33 = uVar33 - 1 & uVar33;
          uVar37 = *(ulong *)(uVar24 + lVar25 * 8);
        } while (uVar33 != 0);
      }
    }
    local_cb0 = (ulong)((uint)uVar37 & 0xf) - 8;
    uVar37 = uVar37 & 0xfffffffffffffff0;
    for (local_c90 = 0; puVar23 = local_cf0, local_c90 != local_cb0; local_c90 = local_c90 + 1) {
      lVar25 = local_c90 * 0x90;
      local_c98 = uVar37 + lVar25;
      fVar12 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(uVar37 + 0x80 + lVar25)) *
               *(float *)(uVar37 + 0x84 + lVar25);
      auVar40._8_8_ = 0;
      auVar40._0_8_ = *(ulong *)(uVar37 + 0x20 + lVar25);
      auVar54._8_8_ = 0;
      auVar54._0_8_ = *(ulong *)(uVar37 + 0x24 + lVar25);
      uVar13 = vpcmpub_avx512vl(auVar40,auVar54,2);
      auVar40 = vpmovzxbd_avx(auVar40);
      uVar2 = *(undefined4 *)(uVar37 + 0x44 + lVar25);
      auVar48._4_4_ = uVar2;
      auVar48._0_4_ = uVar2;
      auVar48._8_4_ = uVar2;
      auVar48._12_4_ = uVar2;
      uVar2 = *(undefined4 *)(uVar37 + 0x38 + lVar25);
      auVar53._4_4_ = uVar2;
      auVar53._0_4_ = uVar2;
      auVar53._8_4_ = uVar2;
      auVar53._12_4_ = uVar2;
      auVar40 = vcvtdq2ps_avx(auVar40);
      auVar41 = vfmadd213ps_fma(auVar40,auVar48,auVar53);
      auVar43._8_8_ = 0;
      auVar43._0_8_ = *(ulong *)(uVar37 + 0x50 + lVar25);
      auVar40 = vpmovzxbd_avx(auVar43);
      auVar40 = vcvtdq2ps_avx(auVar40);
      uVar2 = *(undefined4 *)(uVar37 + 0x74 + lVar25);
      auVar100._4_4_ = uVar2;
      auVar100._0_4_ = uVar2;
      auVar100._8_4_ = uVar2;
      auVar100._12_4_ = uVar2;
      uVar2 = *(undefined4 *)(uVar37 + 0x68 + lVar25);
      auVar103._4_4_ = uVar2;
      auVar103._0_4_ = uVar2;
      auVar103._8_4_ = uVar2;
      auVar103._12_4_ = uVar2;
      auVar40 = vfmadd213ps_fma(auVar40,auVar100,auVar103);
      auVar88._4_4_ = fVar12;
      auVar88._0_4_ = fVar12;
      auVar88._8_4_ = fVar12;
      auVar88._12_4_ = fVar12;
      auVar40 = vsubps_avx(auVar40,auVar41);
      auVar41 = vfmadd213ps_fma(auVar40,auVar88,auVar41);
      auVar40 = vpmovzxbd_avx(auVar54);
      auVar40 = vcvtdq2ps_avx(auVar40);
      auVar42 = vfmadd213ps_fma(auVar40,auVar48,auVar53);
      auVar47._8_8_ = 0;
      auVar47._0_8_ = *(ulong *)(uVar37 + 0x54 + lVar25);
      auVar40 = vpmovzxbd_avx(auVar47);
      auVar40 = vcvtdq2ps_avx(auVar40);
      auVar40 = vfmadd213ps_fma(auVar40,auVar100,auVar103);
      auVar40 = vsubps_avx(auVar40,auVar42);
      auVar42 = vfmadd213ps_fma(auVar40,auVar88,auVar42);
      auVar49._8_8_ = 0;
      auVar49._0_8_ = *(ulong *)(uVar37 + 0x28 + lVar25);
      auVar40 = vpmovzxbd_avx(auVar49);
      auVar40 = vcvtdq2ps_avx(auVar40);
      uVar2 = *(undefined4 *)(uVar37 + 0x48 + lVar25);
      auVar91._4_4_ = uVar2;
      auVar91._0_4_ = uVar2;
      auVar91._8_4_ = uVar2;
      auVar91._12_4_ = uVar2;
      uVar2 = *(undefined4 *)(uVar37 + 0x3c + lVar25);
      auVar96._4_4_ = uVar2;
      auVar96._0_4_ = uVar2;
      auVar96._8_4_ = uVar2;
      auVar96._12_4_ = uVar2;
      auVar44 = vfmadd213ps_fma(auVar40,auVar91,auVar96);
      auVar101._8_8_ = 0;
      auVar101._0_8_ = *(ulong *)(uVar37 + 0x58 + lVar25);
      auVar40 = vpmovzxbd_avx(auVar101);
      auVar40 = vcvtdq2ps_avx(auVar40);
      uVar2 = *(undefined4 *)(uVar37 + 0x78 + lVar25);
      auVar104._4_4_ = uVar2;
      auVar104._0_4_ = uVar2;
      auVar104._8_4_ = uVar2;
      auVar104._12_4_ = uVar2;
      uVar2 = *(undefined4 *)(uVar37 + 0x6c + lVar25);
      auVar107._4_4_ = uVar2;
      auVar107._0_4_ = uVar2;
      auVar107._8_4_ = uVar2;
      auVar107._12_4_ = uVar2;
      auVar40 = vfmadd213ps_fma(auVar40,auVar104,auVar107);
      auVar40 = vsubps_avx(auVar40,auVar44);
      auVar44 = vfmadd213ps_fma(auVar40,auVar88,auVar44);
      auVar50._8_8_ = 0;
      auVar50._0_8_ = *(ulong *)(uVar37 + 0x2c + lVar25);
      auVar40 = vpmovzxbd_avx(auVar50);
      auVar40 = vcvtdq2ps_avx(auVar40);
      auVar90 = vfmadd213ps_fma(auVar40,auVar91,auVar96);
      auVar92._8_8_ = 0;
      auVar92._0_8_ = *(ulong *)(uVar37 + 0x5c + lVar25);
      auVar40 = vpmovzxbd_avx(auVar92);
      auVar40 = vcvtdq2ps_avx(auVar40);
      auVar40 = vfmadd213ps_fma(auVar40,auVar104,auVar107);
      auVar40 = vsubps_avx(auVar40,auVar90);
      auVar90 = vfmadd213ps_fma(auVar40,auVar88,auVar90);
      auVar51._8_8_ = 0;
      auVar51._0_8_ = *(ulong *)(uVar37 + 0x30 + lVar25);
      auVar40 = vpmovzxbd_avx(auVar51);
      auVar40 = vcvtdq2ps_avx(auVar40);
      uVar2 = *(undefined4 *)(uVar37 + 0x4c + lVar25);
      auVar97._4_4_ = uVar2;
      auVar97._0_4_ = uVar2;
      auVar97._8_4_ = uVar2;
      auVar97._12_4_ = uVar2;
      uVar2 = *(undefined4 *)(uVar37 + 0x40 + lVar25);
      auVar105._4_4_ = uVar2;
      auVar105._0_4_ = uVar2;
      auVar105._8_4_ = uVar2;
      auVar105._12_4_ = uVar2;
      auVar45 = vfmadd213ps_fma(auVar40,auVar97,auVar105);
      auVar108._8_8_ = 0;
      auVar108._0_8_ = *(ulong *)(uVar37 + 0x60 + lVar25);
      auVar40 = vpmovzxbd_avx(auVar108);
      uVar2 = *(undefined4 *)(uVar37 + 0x7c + lVar25);
      auVar110._4_4_ = uVar2;
      auVar110._0_4_ = uVar2;
      auVar110._8_4_ = uVar2;
      auVar110._12_4_ = uVar2;
      uVar2 = *(undefined4 *)(uVar37 + 0x70 + lVar25);
      auVar113._4_4_ = uVar2;
      auVar113._0_4_ = uVar2;
      auVar113._8_4_ = uVar2;
      auVar113._12_4_ = uVar2;
      auVar40 = vcvtdq2ps_avx(auVar40);
      auVar40 = vfmadd213ps_fma(auVar40,auVar110,auVar113);
      auVar40 = vsubps_avx(auVar40,auVar45);
      auVar45 = vfmadd213ps_fma(auVar40,auVar88,auVar45);
      auVar52._8_8_ = 0;
      auVar52._0_8_ = *(ulong *)(uVar37 + 0x34 + lVar25);
      auVar40 = vpmovzxbd_avx(auVar52);
      auVar40 = vcvtdq2ps_avx(auVar40);
      auVar43 = vfmadd213ps_fma(auVar40,auVar97,auVar105);
      auVar98._8_8_ = 0;
      auVar98._0_8_ = *(ulong *)(uVar37 + 100 + lVar25);
      auVar40 = vpmovzxbd_avx(auVar98);
      auVar40 = vcvtdq2ps_avx(auVar40);
      auVar40 = vfmadd213ps_fma(auVar40,auVar110,auVar113);
      auVar40 = vsubps_avx(auVar40,auVar43);
      auVar40 = vfmadd213ps_fma(auVar40,auVar88,auVar43);
      auVar41 = vsubps_avx512vl(auVar41,auVar123._0_16_);
      auVar43 = vmulps_avx512vl(auVar126._0_16_,auVar41);
      auVar41 = vsubps_avx512vl(auVar44,auVar124._0_16_);
      auVar44 = vmulps_avx512vl(auVar127._0_16_,auVar41);
      auVar41 = vsubps_avx512vl(auVar45,auVar125._0_16_);
      auVar45 = vmulps_avx512vl(auVar128._0_16_,auVar41);
      auVar41 = vsubps_avx512vl(auVar42,auVar123._0_16_);
      auVar46._0_4_ = fVar87 * auVar41._0_4_;
      auVar46._4_4_ = fVar82 * auVar41._4_4_;
      auVar46._8_4_ = fVar83 * auVar41._8_4_;
      auVar46._12_4_ = fVar84 * auVar41._12_4_;
      auVar41 = vsubps_avx512vl(auVar90,auVar124._0_16_);
      auVar93._0_4_ = fVar39 * auVar41._0_4_;
      auVar93._4_4_ = fVar85 * auVar41._4_4_;
      auVar93._8_4_ = fVar86 * auVar41._8_4_;
      auVar93._12_4_ = fVar116 * auVar41._12_4_;
      auVar40 = vsubps_avx512vl(auVar40,auVar125._0_16_);
      auVar99._0_4_ = fVar81 * auVar40._0_4_;
      auVar99._4_4_ = fVar117 * auVar40._4_4_;
      auVar99._8_4_ = fVar118 * auVar40._8_4_;
      auVar99._12_4_ = fVar119 * auVar40._12_4_;
      auVar41 = vpminsd_avx(auVar43,auVar46);
      auVar40 = vpmaxsd_avx(auVar43,auVar46);
      auVar42 = vpminsd_avx(auVar44,auVar93);
      auVar41 = vpmaxsd_avx(auVar41,auVar42);
      auVar42 = vpmaxsd_avx(auVar44,auVar93);
      auVar44 = vpminsd_avx(auVar40,auVar42);
      auVar42 = vpminsd_avx(auVar45,auVar99);
      auVar40 = vpmaxsd_avx(auVar45,auVar99);
      auVar42 = vpmaxsd_avx(auVar42,auVar120._0_16_);
      auVar41 = vpmaxsd_avx(auVar41,auVar42);
      auVar40 = vpminsd_avx(auVar40,auVar121._0_16_);
      auVar40 = vpminsd_avx(auVar44,auVar40);
      uVar14 = vpcmpd_avx512vl(auVar41,auVar40,2);
      for (local_c80 = CONCAT44((int)((ulong)lVar25 >> 0x20),
                                (uint)((byte)uVar13 & 0xf & (byte)uVar14)); local_c80 != 0;
          local_c80 = local_c80 - 1 & local_c80) {
        lVar25 = 0;
        for (uVar35 = local_c80; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
          lVar25 = lVar25 + 1;
        }
        uVar4 = *(ushort *)(local_c98 + lVar25 * 8);
        uVar5 = *(ushort *)(local_c98 + 2 + lVar25 * 8);
        local_cb8 = (ulong)*(uint *)(local_c98 + 0x88);
        local_ca8 = (ulong)*(uint *)(local_c98 + 4 + lVar25 * 8);
        local_c68 = context->scene;
        pGVar34 = (local_c68->geometries).items[local_cb8].ptr;
        local_c70 = *(long *)&pGVar34->field_0x58;
        BVar3 = pGVar34->time_range;
        auVar41._8_8_ = 0;
        auVar41._0_4_ = BVar3.lower;
        auVar41._4_4_ = BVar3.upper;
        fVar87 = BVar3.lower;
        auVar55._4_4_ = fVar87;
        auVar55._0_4_ = fVar87;
        auVar55._8_4_ = fVar87;
        auVar55._12_4_ = fVar87;
        auVar55._16_4_ = fVar87;
        auVar55._20_4_ = fVar87;
        auVar55._24_4_ = fVar87;
        auVar55._28_4_ = fVar87;
        fVar87 = pGVar34->fnumTimeSegments;
        auVar89._4_4_ = fVar87;
        auVar89._0_4_ = fVar87;
        auVar89._8_4_ = fVar87;
        auVar89._12_4_ = fVar87;
        auVar55 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar55);
        auVar40 = vmovshdup_avx(auVar41);
        auVar40 = vsubps_avx(auVar40,auVar41);
        auVar75._0_4_ = auVar40._0_4_;
        auVar75._4_4_ = auVar75._0_4_;
        auVar75._8_4_ = auVar75._0_4_;
        auVar75._12_4_ = auVar75._0_4_;
        auVar75._16_4_ = auVar75._0_4_;
        auVar75._20_4_ = auVar75._0_4_;
        auVar75._24_4_ = auVar75._0_4_;
        auVar75._28_4_ = auVar75._0_4_;
        auVar55 = vdivps_avx(auVar55,auVar75);
        auVar79._4_4_ = fVar87 * auVar55._4_4_;
        auVar79._0_4_ = fVar87 * auVar55._0_4_;
        auVar79._8_4_ = fVar87 * auVar55._8_4_;
        auVar79._12_4_ = fVar87 * auVar55._12_4_;
        auVar79._16_4_ = fVar87 * auVar55._16_4_;
        auVar79._20_4_ = fVar87 * auVar55._20_4_;
        auVar79._24_4_ = fVar87 * auVar55._24_4_;
        auVar79._28_4_ = auVar55._28_4_;
        auVar55 = vroundps_avx(auVar79,1);
        auVar40 = vaddss_avx512f(auVar89,SUB6416(ZEXT464(0xbf800000),0));
        auVar76._0_4_ = auVar40._0_4_;
        auVar76._4_4_ = auVar76._0_4_;
        auVar76._8_4_ = auVar76._0_4_;
        auVar76._12_4_ = auVar76._0_4_;
        auVar76._16_4_ = auVar76._0_4_;
        auVar76._20_4_ = auVar76._0_4_;
        auVar76._24_4_ = auVar76._0_4_;
        auVar76._28_4_ = auVar76._0_4_;
        auVar55 = vminps_avx(auVar55,auVar76);
        auVar55 = vmaxps_avx512vl(auVar55,auVar122._0_32_);
        local_a80 = vsubps_avx(auVar79,auVar55);
        local_aa0 = vcvtps2dq_avx(auVar55);
        local_c78 = pGVar34[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                    local_ca8;
        local_cbc = uVar4 & 0x7fff;
        local_cc0 = uVar5 & 0x7fff;
        uVar32 = *(uint *)(local_c70 + 4 + local_c78);
        local_c60 = (ulong)uVar32;
        uVar24 = (ulong)(uVar32 * local_cc0 + *(int *)(local_c70 + local_c78) + local_cbc);
        lVar25 = *(long *)&pGVar34[2].numPrimitives;
        lVar28 = (long)*(int *)(local_aa0 + k * 4) * 0x38;
        lVar6 = *(long *)(lVar25 + 0x10 + lVar28);
        lVar7 = *(long *)(lVar25 + lVar28);
        auVar40 = *(undefined1 (*) [16])(lVar7 + lVar6 * uVar24);
        lVar8 = *(long *)(lVar25 + 0x48 + lVar28);
        auVar41 = *(undefined1 (*) [16])(lVar7 + (uVar24 + 1) * lVar6);
        lVar31 = local_c60 + uVar24;
        auVar42 = *(undefined1 (*) [16])(lVar7 + lVar31 * lVar6);
        lVar29 = uVar24 + local_c60 + 1;
        auVar44 = *(undefined1 (*) [16])(lVar7 + lVar29 * lVar6);
        local_c50 = lVar8 * lVar31;
        local_c58 = lVar8 * lVar29;
        uVar35 = (ulong)(-1 < (short)uVar4);
        lVar26 = uVar24 + uVar35 + 1;
        auVar90 = *(undefined1 (*) [16])(lVar7 + lVar26 * lVar6);
        lVar27 = uVar35 + lVar29;
        auVar45 = *(undefined1 (*) [16])(lVar7 + lVar27 * lVar6);
        uVar35 = 0;
        if (-1 < (short)uVar5) {
          uVar35 = local_c60;
        }
        auVar43 = *(undefined1 (*) [16])(lVar7 + (lVar31 + uVar35) * lVar6);
        auVar88 = *(undefined1 (*) [16])(lVar7 + (lVar29 + uVar35) * lVar6);
        auVar54 = *(undefined1 (*) [16])(lVar7 + lVar6 * (uVar35 + lVar27));
        lVar25 = *(long *)(lVar25 + 0x38 + lVar28);
        auVar46 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(local_a80 + local_cd0 * 4)));
        auVar47 = vsubps_avx(*(undefined1 (*) [16])(lVar25 + lVar8 * uVar24),auVar40);
        auVar47 = vfmadd213ps_avx512vl(auVar47,auVar46,auVar40);
        auVar40 = vsubps_avx(*(undefined1 (*) [16])(lVar25 + lVar8 * (uVar24 + 1)),auVar41);
        auVar48 = vfmadd213ps_avx512vl(auVar40,auVar46,auVar41);
        auVar40 = vsubps_avx(*(undefined1 (*) [16])(lVar25 + local_c50),auVar42);
        auVar49 = vfmadd213ps_avx512vl(auVar40,auVar46,auVar42);
        auVar40 = vsubps_avx(*(undefined1 (*) [16])(lVar25 + local_c58),auVar44);
        auVar50 = vfmadd213ps_avx512vl(auVar40,auVar46,auVar44);
        auVar40 = vsubps_avx(*(undefined1 (*) [16])(lVar25 + lVar8 * lVar26),auVar90);
        auVar41 = vfmadd213ps_avx512vl(auVar40,auVar46,auVar90);
        auVar40 = vsubps_avx(*(undefined1 (*) [16])(lVar25 + lVar8 * lVar27),auVar45);
        auVar51 = vfmadd213ps_avx512vl(auVar40,auVar46,auVar45);
        auVar40 = vsubps_avx(*(undefined1 (*) [16])(lVar25 + lVar8 * (lVar31 + uVar35)),auVar43);
        auVar52 = vfmadd213ps_avx512vl(auVar40,auVar46,auVar43);
        auVar40 = vsubps_avx512vl(*(undefined1 (*) [16])(lVar25 + lVar8 * (lVar29 + uVar35)),auVar88
                                 );
        auVar53 = vfmadd213ps_avx512vl(auVar40,auVar46,auVar88);
        auVar40 = vsubps_avx512vl(*(undefined1 (*) [16])(lVar25 + (uVar35 + lVar27) * lVar8),auVar54
                                 );
        auVar54 = vfmadd213ps_avx512vl(auVar40,auVar46,auVar54);
        auVar42 = vunpcklps_avx(auVar48,auVar51);
        auVar40 = vunpckhps_avx(auVar48,auVar51);
        auVar44 = vunpcklps_avx(auVar41,auVar50);
        auVar41 = vunpckhps_avx(auVar41,auVar50);
        auVar90 = vunpcklps_avx(auVar40,auVar41);
        auVar45 = vunpcklps_avx(auVar42,auVar44);
        auVar40 = vunpckhps_avx(auVar42,auVar44);
        auVar44 = vunpcklps_avx(auVar49,auVar53);
        auVar41 = vunpckhps_avx(auVar49,auVar53);
        auVar43 = vunpcklps_avx(auVar50,auVar52);
        auVar42 = vunpckhps_avx(auVar50,auVar52);
        auVar42 = vunpcklps_avx(auVar41,auVar42);
        auVar88 = vunpcklps_avx(auVar44,auVar43);
        auVar41 = vunpckhps_avx(auVar44,auVar43);
        auVar62._16_16_ = auVar53;
        auVar62._0_16_ = auVar49;
        auVar58._16_16_ = auVar51;
        auVar58._0_16_ = auVar48;
        auVar55 = vunpcklps_avx(auVar58,auVar62);
        auVar67._16_16_ = auVar50;
        auVar67._0_16_ = auVar47;
        auVar64._16_16_ = auVar54;
        auVar64._0_16_ = auVar50;
        auVar79 = vunpcklps_avx(auVar67,auVar64);
        auVar76 = vunpcklps_avx(auVar79,auVar55);
        auVar79 = vunpckhps_avx(auVar79,auVar55);
        auVar55 = vunpckhps_avx(auVar58,auVar62);
        auVar75 = vunpckhps_avx(auVar67,auVar64);
        auVar75 = vunpcklps_avx(auVar75,auVar55);
        auVar63._16_16_ = auVar45;
        auVar63._0_16_ = auVar45;
        auVar65._16_16_ = auVar40;
        auVar65._0_16_ = auVar40;
        auVar66._16_16_ = auVar90;
        auVar66._0_16_ = auVar90;
        auVar68._16_16_ = auVar88;
        auVar68._0_16_ = auVar88;
        auVar69._16_16_ = auVar41;
        auVar69._0_16_ = auVar41;
        uVar2 = *(undefined4 *)(local_cc8 + local_cd0 * 4);
        auVar70._4_4_ = uVar2;
        auVar70._0_4_ = uVar2;
        auVar70._8_4_ = uVar2;
        auVar70._12_4_ = uVar2;
        auVar70._16_4_ = uVar2;
        auVar70._20_4_ = uVar2;
        auVar70._24_4_ = uVar2;
        auVar70._28_4_ = uVar2;
        uVar2 = *(undefined4 *)(local_cc8 + local_cd0 * 4 + 0x20);
        auVar73._4_4_ = uVar2;
        auVar73._0_4_ = uVar2;
        auVar73._8_4_ = uVar2;
        auVar73._12_4_ = uVar2;
        auVar73._16_4_ = uVar2;
        auVar73._20_4_ = uVar2;
        auVar73._24_4_ = uVar2;
        auVar73._28_4_ = uVar2;
        auVar56 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(local_cc8 + local_cd0 * 4 + 0x40)));
        uVar2 = *(undefined4 *)(local_cc8 + local_cd0 * 4 + 0x80);
        auVar102._4_4_ = uVar2;
        auVar102._0_4_ = uVar2;
        auVar102._8_4_ = uVar2;
        auVar102._12_4_ = uVar2;
        auVar102._16_4_ = uVar2;
        auVar102._20_4_ = uVar2;
        auVar102._24_4_ = uVar2;
        auVar102._28_4_ = uVar2;
        auVar57 = vinsertf32x4_avx512vl(ZEXT1632(auVar42),auVar42,1);
        uVar2 = *(undefined4 *)(local_cc8 + local_cd0 * 4 + 0xa0);
        auVar111._4_4_ = uVar2;
        auVar111._0_4_ = uVar2;
        auVar111._8_4_ = uVar2;
        auVar111._12_4_ = uVar2;
        auVar111._16_4_ = uVar2;
        auVar111._20_4_ = uVar2;
        auVar111._24_4_ = uVar2;
        auVar111._28_4_ = uVar2;
        fVar87 = *(float *)(local_cc8 + local_cd0 * 4 + 0xc0);
        auVar114._4_4_ = fVar87;
        auVar114._0_4_ = fVar87;
        auVar114._8_4_ = fVar87;
        auVar114._12_4_ = fVar87;
        auVar114._16_4_ = fVar87;
        auVar114._20_4_ = fVar87;
        auVar114._24_4_ = fVar87;
        auVar114._28_4_ = fVar87;
        auVar55 = vsubps_avx(auVar76,auVar70);
        auVar79 = vsubps_avx(auVar79,auVar73);
        auVar58 = vsubps_avx512vl(auVar75,auVar56);
        auVar75 = vsubps_avx(auVar63,auVar70);
        auVar76 = vsubps_avx(auVar65,auVar73);
        auVar59 = vsubps_avx512vl(auVar66,auVar56);
        auVar60 = vsubps_avx512vl(auVar68,auVar70);
        auVar61 = vsubps_avx512vl(auVar69,auVar73);
        auVar56 = vsubps_avx512vl(auVar57,auVar56);
        auVar62 = vsubps_avx512vl(auVar60,auVar55);
        auVar63 = vsubps_avx512vl(auVar61,auVar79);
        auVar64 = vsubps_avx512vl(auVar56,auVar58);
        auVar65 = vsubps_avx512vl(auVar55,auVar75);
        auVar66 = vsubps_avx512vl(auVar79,auVar76);
        auVar67 = vsubps_avx512vl(auVar58,auVar59);
        auVar68 = vsubps_avx512vl(auVar75,auVar60);
        auVar69 = vsubps_avx512vl(auVar76,auVar61);
        auVar70 = vsubps_avx512vl(auVar59,auVar56);
        auVar57 = vaddps_avx512vl(auVar60,auVar55);
        auVar71 = vaddps_avx512vl(auVar61,auVar79);
        auVar72 = vaddps_avx512vl(auVar56,auVar58);
        auVar73 = vmulps_avx512vl(auVar71,auVar64);
        auVar73 = vfmsub231ps_avx512vl(auVar73,auVar63,auVar72);
        auVar72 = vmulps_avx512vl(auVar72,auVar62);
        auVar74 = vfmsub231ps_avx512vl(auVar72,auVar64,auVar57);
        auVar72._4_4_ = auVar57._4_4_ * auVar63._4_4_;
        auVar72._0_4_ = auVar57._0_4_ * auVar63._0_4_;
        auVar72._8_4_ = auVar57._8_4_ * auVar63._8_4_;
        auVar72._12_4_ = auVar57._12_4_ * auVar63._12_4_;
        auVar72._16_4_ = auVar57._16_4_ * auVar63._16_4_;
        auVar72._20_4_ = auVar57._20_4_ * auVar63._20_4_;
        auVar72._24_4_ = auVar57._24_4_ * auVar63._24_4_;
        auVar72._28_4_ = auVar57._28_4_;
        auVar40 = vfmsub231ps_fma(auVar72,auVar62,auVar71);
        auVar109._0_4_ = auVar40._0_4_ * fVar87;
        auVar109._4_4_ = auVar40._4_4_ * fVar87;
        auVar109._8_4_ = auVar40._8_4_ * fVar87;
        auVar109._12_4_ = auVar40._12_4_ * fVar87;
        auVar109._16_4_ = fVar87 * 0.0;
        auVar109._20_4_ = fVar87 * 0.0;
        auVar109._24_4_ = fVar87 * 0.0;
        auVar109._28_4_ = 0;
        auVar57 = vfmadd231ps_avx512vl(auVar109,auVar111,auVar74);
        auVar72 = vfmadd231ps_avx512vl(auVar57,auVar102,auVar73);
        auVar115._0_4_ = auVar55._0_4_ + auVar75._0_4_;
        auVar115._4_4_ = auVar55._4_4_ + auVar75._4_4_;
        auVar115._8_4_ = auVar55._8_4_ + auVar75._8_4_;
        auVar115._12_4_ = auVar55._12_4_ + auVar75._12_4_;
        auVar115._16_4_ = auVar55._16_4_ + auVar75._16_4_;
        auVar115._20_4_ = auVar55._20_4_ + auVar75._20_4_;
        auVar115._24_4_ = auVar55._24_4_ + auVar75._24_4_;
        auVar115._28_4_ = auVar55._28_4_ + auVar75._28_4_;
        auVar57 = vaddps_avx512vl(auVar79,auVar76);
        auVar71 = vaddps_avx512vl(auVar58,auVar59);
        auVar73 = vmulps_avx512vl(auVar57,auVar67);
        auVar73 = vfmsub231ps_avx512vl(auVar73,auVar66,auVar71);
        auVar71 = vmulps_avx512vl(auVar71,auVar65);
        auVar74 = vfmsub231ps_avx512vl(auVar71,auVar67,auVar115);
        auVar71 = vmulps_avx512vl(auVar115,auVar66);
        auVar57 = vfmsub231ps_avx512vl(auVar71,auVar65,auVar57);
        auVar71._4_4_ = auVar57._4_4_ * fVar87;
        auVar71._0_4_ = auVar57._0_4_ * fVar87;
        auVar71._8_4_ = auVar57._8_4_ * fVar87;
        auVar71._12_4_ = auVar57._12_4_ * fVar87;
        auVar71._16_4_ = auVar57._16_4_ * fVar87;
        auVar71._20_4_ = auVar57._20_4_ * fVar87;
        auVar71._24_4_ = auVar57._24_4_ * fVar87;
        auVar71._28_4_ = auVar57._28_4_;
        auVar57 = vfmadd231ps_avx512vl(auVar71,auVar111,auVar74);
        auVar71 = vfmadd231ps_avx512vl(auVar57,auVar102,auVar73);
        auVar41 = vxorps_avx512vl(auVar73._0_16_,auVar73._0_16_);
        auVar122 = ZEXT1664(auVar41);
        auVar75 = vaddps_avx512vl(auVar75,auVar60);
        auVar76 = vaddps_avx512vl(auVar76,auVar61);
        auVar56 = vaddps_avx512vl(auVar59,auVar56);
        auVar57 = vmulps_avx512vl(auVar76,auVar70);
        auVar57 = vfmsub231ps_avx512vl(auVar57,auVar69,auVar56);
        auVar56 = vmulps_avx512vl(auVar56,auVar68);
        auVar56 = vfmsub231ps_avx512vl(auVar56,auVar70,auVar75);
        auVar60._4_4_ = auVar75._4_4_ * auVar69._4_4_;
        auVar60._0_4_ = auVar75._0_4_ * auVar69._0_4_;
        auVar60._8_4_ = auVar75._8_4_ * auVar69._8_4_;
        auVar60._12_4_ = auVar75._12_4_ * auVar69._12_4_;
        auVar60._16_4_ = auVar75._16_4_ * auVar69._16_4_;
        auVar60._20_4_ = auVar75._20_4_ * auVar69._20_4_;
        auVar60._24_4_ = auVar75._24_4_ * auVar69._24_4_;
        auVar60._28_4_ = auVar75._28_4_;
        auVar40 = vfmsub231ps_fma(auVar60,auVar68,auVar76);
        auVar75 = vmulps_avx512vl(ZEXT1632(auVar40),auVar114);
        auVar75 = vfmadd231ps_avx512vl(auVar75,auVar111,auVar56);
        auVar75 = vfmadd231ps_avx512vl(auVar75,auVar102,auVar57);
        auVar61._0_4_ = auVar72._0_4_ + auVar71._0_4_;
        auVar61._4_4_ = auVar72._4_4_ + auVar71._4_4_;
        auVar61._8_4_ = auVar72._8_4_ + auVar71._8_4_;
        auVar61._12_4_ = auVar72._12_4_ + auVar71._12_4_;
        auVar61._16_4_ = auVar72._16_4_ + auVar71._16_4_;
        auVar61._20_4_ = auVar72._20_4_ + auVar71._20_4_;
        auVar61._24_4_ = auVar72._24_4_ + auVar71._24_4_;
        auVar61._28_4_ = auVar72._28_4_ + auVar71._28_4_;
        local_a20 = vaddps_avx512vl(auVar75,auVar61);
        auVar56._8_4_ = 0x7fffffff;
        auVar56._0_8_ = 0x7fffffff7fffffff;
        auVar56._12_4_ = 0x7fffffff;
        auVar56._16_4_ = 0x7fffffff;
        auVar56._20_4_ = 0x7fffffff;
        auVar56._24_4_ = 0x7fffffff;
        auVar56._28_4_ = 0x7fffffff;
        vandps_avx512vl(local_a20,auVar56);
        auVar57._8_4_ = 0x34000000;
        auVar57._0_8_ = 0x3400000034000000;
        auVar57._12_4_ = 0x34000000;
        auVar57._16_4_ = 0x34000000;
        auVar57._20_4_ = 0x34000000;
        auVar57._24_4_ = 0x34000000;
        auVar57._28_4_ = 0x34000000;
        auVar76 = vmulps_avx512vl(local_a20,auVar57);
        auVar56 = vminps_avx512vl(auVar72,auVar71);
        auVar56 = vminps_avx512vl(auVar56,auVar75);
        auVar59._8_4_ = 0x80000000;
        auVar59._0_8_ = 0x8000000080000000;
        auVar59._12_4_ = 0x80000000;
        auVar59._16_4_ = 0x80000000;
        auVar59._20_4_ = 0x80000000;
        auVar59._24_4_ = 0x80000000;
        auVar59._28_4_ = 0x80000000;
        auVar57 = vxorps_avx512vl(auVar76,auVar59);
        uVar13 = vcmpps_avx512vl(auVar56,auVar57,5);
        auVar56 = vmaxps_avx512vl(auVar72,auVar71);
        auVar75 = vmaxps_avx512vl(auVar56,auVar75);
        uVar14 = vcmpps_avx512vl(auVar75,auVar76,2);
        bVar16 = (byte)uVar13 | (byte)uVar14;
        k = local_cd0;
        ray = local_cc8;
        if (bVar16 != 0) {
          auVar75 = vmulps_avx512vl(auVar66,auVar64);
          auVar76 = vmulps_avx512vl(auVar62,auVar67);
          auVar56 = vmulps_avx512vl(auVar65,auVar63);
          auVar57 = vmulps_avx512vl(auVar69,auVar67);
          auVar59 = vmulps_avx512vl(auVar65,auVar70);
          auVar60 = vmulps_avx512vl(auVar68,auVar66);
          auVar61 = vfmsub213ps_avx512vl(auVar63,auVar67,auVar75);
          auVar63 = vfmsub213ps_avx512vl(auVar64,auVar65,auVar76);
          auVar62 = vfmsub213ps_avx512vl(auVar62,auVar66,auVar56);
          auVar64 = vfmsub213ps_avx512vl(auVar70,auVar66,auVar57);
          auVar66 = vfmsub213ps_avx512vl(auVar68,auVar67,auVar59);
          auVar65 = vfmsub213ps_avx512vl(auVar69,auVar65,auVar60);
          auVar67 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar75,auVar67);
          vandps_avx512vl(auVar57,auVar67);
          uVar35 = vcmpps_avx512vl(auVar67,auVar67,1);
          vandps_avx512vl(auVar76,auVar67);
          vandps_avx512vl(auVar59,auVar67);
          uVar24 = vcmpps_avx512vl(auVar67,auVar67,1);
          vandps_avx512vl(auVar56,auVar67);
          vandps_avx512vl(auVar60,auVar67);
          uVar33 = vcmpps_avx512vl(auVar67,auVar67,1);
          bVar10 = (bool)((byte)uVar35 & 1);
          auVar77._0_4_ = (float)((uint)bVar10 * auVar61._0_4_ | (uint)!bVar10 * auVar64._0_4_);
          bVar10 = (bool)((byte)(uVar35 >> 1) & 1);
          auVar77._4_4_ = (float)((uint)bVar10 * auVar61._4_4_ | (uint)!bVar10 * auVar64._4_4_);
          bVar10 = (bool)((byte)(uVar35 >> 2) & 1);
          auVar77._8_4_ = (float)((uint)bVar10 * auVar61._8_4_ | (uint)!bVar10 * auVar64._8_4_);
          bVar10 = (bool)((byte)(uVar35 >> 3) & 1);
          auVar77._12_4_ = (float)((uint)bVar10 * auVar61._12_4_ | (uint)!bVar10 * auVar64._12_4_);
          bVar10 = (bool)((byte)(uVar35 >> 4) & 1);
          auVar77._16_4_ = (float)((uint)bVar10 * auVar61._16_4_ | (uint)!bVar10 * auVar64._16_4_);
          bVar10 = (bool)((byte)(uVar35 >> 5) & 1);
          auVar77._20_4_ = (float)((uint)bVar10 * auVar61._20_4_ | (uint)!bVar10 * auVar64._20_4_);
          bVar10 = (bool)((byte)(uVar35 >> 6) & 1);
          auVar77._24_4_ = (float)((uint)bVar10 * auVar61._24_4_ | (uint)!bVar10 * auVar64._24_4_);
          bVar10 = SUB81(uVar35 >> 7,0);
          auVar77._28_4_ = (uint)bVar10 * auVar61._28_4_ | (uint)!bVar10 * auVar64._28_4_;
          bVar10 = (bool)((byte)uVar24 & 1);
          auVar78._0_4_ = (float)((uint)bVar10 * auVar63._0_4_ | (uint)!bVar10 * auVar66._0_4_);
          bVar10 = (bool)((byte)(uVar24 >> 1) & 1);
          auVar78._4_4_ = (float)((uint)bVar10 * auVar63._4_4_ | (uint)!bVar10 * auVar66._4_4_);
          bVar10 = (bool)((byte)(uVar24 >> 2) & 1);
          auVar78._8_4_ = (float)((uint)bVar10 * auVar63._8_4_ | (uint)!bVar10 * auVar66._8_4_);
          bVar10 = (bool)((byte)(uVar24 >> 3) & 1);
          auVar78._12_4_ = (float)((uint)bVar10 * auVar63._12_4_ | (uint)!bVar10 * auVar66._12_4_);
          bVar10 = (bool)((byte)(uVar24 >> 4) & 1);
          auVar78._16_4_ = (float)((uint)bVar10 * auVar63._16_4_ | (uint)!bVar10 * auVar66._16_4_);
          bVar10 = (bool)((byte)(uVar24 >> 5) & 1);
          auVar78._20_4_ = (float)((uint)bVar10 * auVar63._20_4_ | (uint)!bVar10 * auVar66._20_4_);
          bVar10 = (bool)((byte)(uVar24 >> 6) & 1);
          auVar78._24_4_ = (float)((uint)bVar10 * auVar63._24_4_ | (uint)!bVar10 * auVar66._24_4_);
          bVar10 = SUB81(uVar24 >> 7,0);
          auVar78._28_4_ = (uint)bVar10 * auVar63._28_4_ | (uint)!bVar10 * auVar66._28_4_;
          bVar10 = (bool)((byte)uVar33 & 1);
          fVar39 = (float)((uint)bVar10 * auVar62._0_4_ | (uint)!bVar10 * auVar65._0_4_);
          bVar10 = (bool)((byte)(uVar33 >> 1) & 1);
          fVar81 = (float)((uint)bVar10 * auVar62._4_4_ | (uint)!bVar10 * auVar65._4_4_);
          bVar10 = (bool)((byte)(uVar33 >> 2) & 1);
          fVar82 = (float)((uint)bVar10 * auVar62._8_4_ | (uint)!bVar10 * auVar65._8_4_);
          bVar10 = (bool)((byte)(uVar33 >> 3) & 1);
          fVar83 = (float)((uint)bVar10 * auVar62._12_4_ | (uint)!bVar10 * auVar65._12_4_);
          bVar10 = (bool)((byte)(uVar33 >> 4) & 1);
          fVar84 = (float)((uint)bVar10 * auVar62._16_4_ | (uint)!bVar10 * auVar65._16_4_);
          bVar10 = (bool)((byte)(uVar33 >> 5) & 1);
          fVar85 = (float)((uint)bVar10 * auVar62._20_4_ | (uint)!bVar10 * auVar65._20_4_);
          bVar10 = (bool)((byte)(uVar33 >> 6) & 1);
          fVar86 = (float)((uint)bVar10 * auVar62._24_4_ | (uint)!bVar10 * auVar65._24_4_);
          bVar10 = SUB81(uVar33 >> 7,0);
          auVar19._4_4_ = fVar87 * fVar81;
          auVar19._0_4_ = fVar87 * fVar39;
          auVar19._8_4_ = fVar87 * fVar82;
          auVar19._12_4_ = fVar87 * fVar83;
          auVar19._16_4_ = fVar87 * fVar84;
          auVar19._20_4_ = fVar87 * fVar85;
          auVar19._24_4_ = fVar87 * fVar86;
          auVar19._28_4_ = fVar87;
          auVar40 = vfmadd213ps_fma(auVar111,auVar78,auVar19);
          auVar40 = vfmadd213ps_fma(auVar102,auVar77,ZEXT1632(auVar40));
          auVar75 = ZEXT1632(CONCAT412(auVar40._12_4_ + auVar40._12_4_,
                                       CONCAT48(auVar40._8_4_ + auVar40._8_4_,
                                                CONCAT44(auVar40._4_4_ + auVar40._4_4_,
                                                         auVar40._0_4_ + auVar40._0_4_))));
          auVar112._0_4_ = auVar58._0_4_ * fVar39;
          auVar112._4_4_ = auVar58._4_4_ * fVar81;
          auVar112._8_4_ = auVar58._8_4_ * fVar82;
          auVar112._12_4_ = auVar58._12_4_ * fVar83;
          auVar112._16_4_ = auVar58._16_4_ * fVar84;
          auVar112._20_4_ = auVar58._20_4_ * fVar85;
          auVar112._24_4_ = auVar58._24_4_ * fVar86;
          auVar112._28_4_ = 0;
          auVar40 = vfmadd213ps_fma(auVar79,auVar78,auVar112);
          auVar42 = vfmadd213ps_fma(auVar55,auVar77,ZEXT1632(auVar40));
          auVar55 = vrcp14ps_avx512vl(auVar75);
          auVar74._8_4_ = 0x3f800000;
          auVar74._0_8_ = 0x3f8000003f800000;
          auVar74._12_4_ = 0x3f800000;
          auVar74._16_4_ = 0x3f800000;
          auVar74._20_4_ = 0x3f800000;
          auVar74._24_4_ = 0x3f800000;
          auVar74._28_4_ = 0x3f800000;
          auVar79 = vfnmadd213ps_avx512vl(auVar55,auVar75,auVar74);
          auVar40 = vfmadd132ps_fma(auVar79,auVar55,auVar55);
          uVar2 = *(undefined4 *)(local_cc8 + local_cd0 * 4 + 0x100);
          local_c40._4_4_ = uVar2;
          local_c40._0_4_ = uVar2;
          local_c40._8_4_ = uVar2;
          local_c40._12_4_ = uVar2;
          local_c40._16_4_ = uVar2;
          local_c40._20_4_ = uVar2;
          local_c40._24_4_ = uVar2;
          local_c40._28_4_ = uVar2;
          auVar120 = ZEXT3264(local_c40);
          local_9a0 = ZEXT1632(CONCAT412(auVar40._12_4_ * (auVar42._12_4_ + auVar42._12_4_),
                                         CONCAT48(auVar40._8_4_ * (auVar42._8_4_ + auVar42._8_4_),
                                                  CONCAT44(auVar40._4_4_ *
                                                           (auVar42._4_4_ + auVar42._4_4_),
                                                           auVar40._0_4_ *
                                                           (auVar42._0_4_ + auVar42._0_4_)))));
          uVar13 = vcmpps_avx512vl(local_9a0,local_c40,2);
          uVar2 = *(undefined4 *)(local_cc8 + local_cd0 * 4 + 0x60);
          auVar17._4_4_ = uVar2;
          auVar17._0_4_ = uVar2;
          auVar17._8_4_ = uVar2;
          auVar17._12_4_ = uVar2;
          auVar17._16_4_ = uVar2;
          auVar17._20_4_ = uVar2;
          auVar17._24_4_ = uVar2;
          auVar17._28_4_ = uVar2;
          uVar14 = vcmpps_avx512vl(local_9a0,auVar17,0xd);
          bVar16 = (byte)uVar13 & (byte)uVar14 & bVar16;
          if (bVar16 != 0) {
            local_ce8 = vcmpps_avx512vl(auVar75,ZEXT1632(auVar41),4);
            local_ce8 = bVar16 & local_ce8;
            if ((char)local_ce8 != '\0') {
              local_a00 = &local_cf1;
              local_9f8 = (char)local_ce8;
              auVar55 = vsubps_avx(local_a20,auVar71);
              local_a60 = vblendps_avx(auVar72,auVar55,0xf0);
              auVar55 = vsubps_avx(local_a20,auVar72);
              local_a40 = vblendps_avx(auVar71,auVar55,0xf0);
              fVar87 = (float)DAT_01fbac00;
              fVar116 = DAT_01fbac00._4_4_;
              local_980._4_4_ = auVar77._4_4_ * fVar116;
              local_980._0_4_ = auVar77._0_4_ * fVar87;
              fVar117 = DAT_01fbac00._8_4_;
              local_980._8_4_ = auVar77._8_4_ * fVar117;
              fVar118 = DAT_01fbac00._12_4_;
              local_980._12_4_ = auVar77._12_4_ * fVar118;
              fVar119 = DAT_01fbac00._16_4_;
              local_980._16_4_ = auVar77._16_4_ * fVar119;
              fVar12 = DAT_01fbac00._20_4_;
              local_980._20_4_ = auVar77._20_4_ * fVar12;
              fVar11 = DAT_01fbac00._24_4_;
              local_980._24_4_ = auVar77._24_4_ * fVar11;
              local_980._28_4_ = auVar77._28_4_;
              local_960._4_4_ = auVar78._4_4_ * fVar116;
              local_960._0_4_ = auVar78._0_4_ * fVar87;
              local_960._8_4_ = auVar78._8_4_ * fVar117;
              local_960._12_4_ = auVar78._12_4_ * fVar118;
              local_960._16_4_ = auVar78._16_4_ * fVar119;
              local_960._20_4_ = auVar78._20_4_ * fVar12;
              local_960._24_4_ = auVar78._24_4_ * fVar11;
              local_960._28_4_ = auVar78._28_4_;
              local_940._4_4_ = fVar81 * fVar116;
              local_940._0_4_ = fVar39 * fVar87;
              local_940._8_4_ = fVar82 * fVar117;
              local_940._12_4_ = fVar83 * fVar118;
              local_940._16_4_ = fVar84 * fVar119;
              local_940._20_4_ = fVar85 * fVar12;
              local_940._24_4_ = fVar86 * fVar11;
              local_940._28_4_ = (uint)bVar10 * auVar62._28_4_ | (uint)!bVar10 * auVar65._28_4_;
              pGVar34 = (local_c68->geometries).items[local_cb8].ptr;
              if ((pGVar34->mask & *(uint *)(local_cc8 + local_cd0 * 4 + 0x120)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar34->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01d66b3d:
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                  goto LAB_01d66b56;
                }
                auVar55 = vpbroadcastd_avx512vl();
                auVar55 = vpaddd_avx2(auVar55,_DAT_01fb7740);
                auVar79 = vpbroadcastd_avx512vl();
                auVar79 = vpaddd_avx2(auVar79,_DAT_01fb7760);
                auVar94._0_4_ = (float)(int)(*(ushort *)(local_c70 + 8 + local_c78) - 1);
                auVar94._4_12_ = auVar58._4_12_;
                auVar22._12_4_ = 0;
                auVar22._0_12_ = ZEXT812(0);
                auVar41 = vrcp14ss_avx512f(auVar22 << 0x20,ZEXT416((uint)auVar94._0_4_));
                auVar40 = vfnmadd213ss_fma(auVar94,auVar41,SUB6416(ZEXT464(0x40000000),0));
                fVar86 = auVar41._0_4_ * auVar40._0_4_;
                auVar106._0_4_ = (float)(int)(*(ushort *)(local_c70 + 10 + local_c78) - 1);
                auVar106._4_12_ = auVar72._4_12_;
                auVar41 = vrcp14ss_avx512f(auVar22 << 0x20,ZEXT416((uint)auVar106._0_4_));
                auVar40 = vfnmadd213ss_fma(auVar106,auVar41,SUB6416(ZEXT464(0x40000000),0));
                fVar116 = auVar41._0_4_ * auVar40._0_4_;
                auVar55 = vcvtdq2ps_avx(auVar55);
                auVar79 = vcvtdq2ps_avx(auVar79);
                auVar18._8_4_ = 0x219392ef;
                auVar18._0_8_ = 0x219392ef219392ef;
                auVar18._12_4_ = 0x219392ef;
                auVar18._16_4_ = 0x219392ef;
                auVar18._20_4_ = 0x219392ef;
                auVar18._24_4_ = 0x219392ef;
                auVar18._28_4_ = 0x219392ef;
                uVar35 = vcmpps_avx512vl(local_a20,auVar18,5);
                auVar75 = vrcp14ps_avx512vl(local_a20);
                auVar95._8_4_ = 0x3f800000;
                auVar95._0_8_ = 0x3f8000003f800000;
                auVar95._12_4_ = 0x3f800000;
                auVar95._16_4_ = 0x3f800000;
                auVar95._20_4_ = 0x3f800000;
                auVar95._24_4_ = 0x3f800000;
                auVar95._28_4_ = 0x3f800000;
                auVar40 = vfnmadd213ps_fma(local_a20,auVar75,auVar95);
                auVar76 = vfmadd132ps_avx512vl(ZEXT1632(auVar40),auVar75,auVar75);
                fVar39 = (float)((uint)((byte)uVar35 & 1) * auVar76._0_4_);
                fVar81 = (float)((uint)((byte)(uVar35 >> 1) & 1) * auVar76._4_4_);
                fVar82 = (float)((uint)((byte)(uVar35 >> 2) & 1) * auVar76._8_4_);
                fVar83 = (float)((uint)((byte)(uVar35 >> 3) & 1) * auVar76._12_4_);
                fVar87 = (float)((uint)((byte)(uVar35 >> 4) & 1) * auVar76._16_4_);
                fVar84 = (float)((uint)((byte)(uVar35 >> 5) & 1) * auVar76._20_4_);
                fVar85 = (float)((uint)((byte)(uVar35 >> 6) & 1) * auVar76._24_4_);
                auVar20._4_4_ =
                     (local_a20._4_4_ * auVar55._4_4_ + local_a60._4_4_) * fVar86 * fVar81;
                auVar20._0_4_ =
                     (local_a20._0_4_ * auVar55._0_4_ + local_a60._0_4_) * fVar86 * fVar39;
                auVar20._8_4_ =
                     (local_a20._8_4_ * auVar55._8_4_ + local_a60._8_4_) * fVar86 * fVar82;
                auVar20._12_4_ =
                     (local_a20._12_4_ * auVar55._12_4_ + local_a60._12_4_) * fVar86 * fVar83;
                auVar20._16_4_ =
                     (local_a20._16_4_ * auVar55._16_4_ + local_a60._16_4_) * fVar86 * fVar87;
                auVar20._20_4_ =
                     (local_a20._20_4_ * auVar55._20_4_ + local_a60._20_4_) * fVar86 * fVar84;
                auVar20._24_4_ =
                     (local_a20._24_4_ * auVar55._24_4_ + local_a60._24_4_) * fVar86 * fVar85;
                auVar20._28_4_ = auVar75._28_4_;
                local_9e0 = vminps_avx(auVar20,auVar95);
                auVar21._4_4_ =
                     (local_a20._4_4_ * auVar79._4_4_ + local_a40._4_4_) * fVar116 * fVar81;
                auVar21._0_4_ =
                     (local_a20._0_4_ * auVar79._0_4_ + local_a40._0_4_) * fVar116 * fVar39;
                auVar21._8_4_ =
                     (local_a20._8_4_ * auVar79._8_4_ + local_a40._8_4_) * fVar116 * fVar82;
                auVar21._12_4_ =
                     (local_a20._12_4_ * auVar79._12_4_ + local_a40._12_4_) * fVar116 * fVar83;
                auVar21._16_4_ =
                     (local_a20._16_4_ * auVar79._16_4_ + local_a40._16_4_) * fVar116 * fVar87;
                auVar21._20_4_ =
                     (local_a20._20_4_ * auVar79._20_4_ + local_a40._20_4_) * fVar116 * fVar84;
                auVar21._24_4_ =
                     (local_a20._24_4_ * auVar79._24_4_ + local_a40._24_4_) * fVar116 * fVar85;
                auVar21._28_4_ = (uint)(byte)(uVar35 >> 7) * auVar76._28_4_;
                local_9c0 = vminps_avx(auVar21,auVar95);
                local_cd8 = 0;
                for (uVar35 = local_ce8; (uVar35 & 1) == 0;
                    uVar35 = uVar35 >> 1 | 0x8000000000000000) {
                  local_cd8 = local_cd8 + 1;
                }
                local_b60 = vpbroadcastd_avx512vl();
                local_b80 = vpbroadcastd_avx512vl();
                local_bc0 = auVar123._0_16_;
                local_bd0 = auVar124._0_16_;
                local_be0 = auVar125._0_16_;
                local_bf0 = auVar126._0_16_;
                local_c00 = auVar127._0_16_;
                local_c10 = auVar128._0_16_;
                local_ce0 = pGVar34;
                while (auVar40 = auVar122._0_16_, local_ce8 != 0) {
                  uVar2 = *(undefined4 *)(local_9e0 + local_cd8 * 4);
                  local_8c0._4_4_ = uVar2;
                  local_8c0._0_4_ = uVar2;
                  local_8c0._8_4_ = uVar2;
                  local_8c0._12_4_ = uVar2;
                  local_8c0._16_4_ = uVar2;
                  local_8c0._20_4_ = uVar2;
                  local_8c0._24_4_ = uVar2;
                  local_8c0._28_4_ = uVar2;
                  uVar2 = *(undefined4 *)(local_9c0 + local_cd8 * 4);
                  local_8a0._4_4_ = uVar2;
                  local_8a0._0_4_ = uVar2;
                  local_8a0._8_4_ = uVar2;
                  local_8a0._12_4_ = uVar2;
                  local_8a0._16_4_ = uVar2;
                  local_8a0._20_4_ = uVar2;
                  local_8a0._24_4_ = uVar2;
                  local_8a0._28_4_ = uVar2;
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_9a0 + local_cd8 * 4);
                  local_bb0.context = context->user;
                  local_920 = *(undefined4 *)(local_980 + local_cd8 * 4);
                  uVar2 = *(undefined4 *)(local_960 + local_cd8 * 4);
                  local_900._4_4_ = uVar2;
                  local_900._0_4_ = uVar2;
                  local_900._8_4_ = uVar2;
                  local_900._12_4_ = uVar2;
                  local_900._16_4_ = uVar2;
                  local_900._20_4_ = uVar2;
                  local_900._24_4_ = uVar2;
                  local_900._28_4_ = uVar2;
                  uVar2 = *(undefined4 *)(local_940 + local_cd8 * 4);
                  local_8e0._4_4_ = uVar2;
                  local_8e0._0_4_ = uVar2;
                  local_8e0._8_4_ = uVar2;
                  local_8e0._12_4_ = uVar2;
                  local_8e0._16_4_ = uVar2;
                  local_8e0._20_4_ = uVar2;
                  local_8e0._24_4_ = uVar2;
                  local_8e0._28_4_ = uVar2;
                  uStack_91c = local_920;
                  uStack_918 = local_920;
                  uStack_914 = local_920;
                  uStack_910 = local_920;
                  uStack_90c = local_920;
                  uStack_908 = local_920;
                  uStack_904 = local_920;
                  local_880 = local_b80._0_8_;
                  uStack_878 = local_b80._8_8_;
                  uStack_870 = local_b80._16_8_;
                  uStack_868 = local_b80._24_8_;
                  local_860 = local_b60;
                  vpcmpeqd_avx2(local_b60,local_b60);
                  uStack_83c = (local_bb0.context)->instID[0];
                  local_840 = uStack_83c;
                  uStack_838 = uStack_83c;
                  uStack_834 = uStack_83c;
                  uStack_830 = uStack_83c;
                  uStack_82c = uStack_83c;
                  uStack_828 = uStack_83c;
                  uStack_824 = uStack_83c;
                  uStack_81c = (local_bb0.context)->instPrimID[0];
                  local_820 = uStack_81c;
                  uStack_818 = uStack_81c;
                  uStack_814 = uStack_81c;
                  uStack_810 = uStack_81c;
                  uStack_80c = uStack_81c;
                  uStack_808 = uStack_81c;
                  uStack_804 = uStack_81c;
                  local_b40 = local_ac0;
                  local_bb0.valid = (int *)local_b40;
                  local_bb0.geometryUserPtr = pGVar34->userPtr;
                  local_bb0.hit = (RTCHitN *)&local_920;
                  local_bb0.N = 8;
                  local_bb0.ray = (RTCRayN *)ray;
                  if (pGVar34->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar34->occlusionFilterN)(&local_bb0);
                    auVar120 = ZEXT3264(local_c40);
                    auVar40 = vxorps_avx512vl(auVar40,auVar40);
                    auVar122 = ZEXT1664(auVar40);
                    auVar128 = ZEXT1664(local_c10);
                    auVar127 = ZEXT1664(local_c00);
                    auVar126 = ZEXT1664(local_bf0);
                    auVar125 = ZEXT1664(local_be0);
                    auVar124 = ZEXT1664(local_bd0);
                    auVar123 = ZEXT1664(local_bc0);
                    k = local_cd0;
                    pGVar34 = local_ce0;
                    ray = local_cc8;
                  }
                  auVar40 = auVar122._0_16_;
                  if (local_b40 != (undefined1  [32])0x0) {
                    p_Var9 = context->args->filter;
                    if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar34->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var9)(&local_bb0);
                      auVar120 = ZEXT3264(local_c40);
                      auVar40 = vxorps_avx512vl(auVar40,auVar40);
                      auVar122 = ZEXT1664(auVar40);
                      auVar128 = ZEXT1664(local_c10);
                      auVar127 = ZEXT1664(local_c00);
                      auVar126 = ZEXT1664(local_bf0);
                      auVar125 = ZEXT1664(local_be0);
                      auVar124 = ZEXT1664(local_bd0);
                      auVar123 = ZEXT1664(local_bc0);
                      k = local_cd0;
                      pGVar34 = local_ce0;
                      ray = local_cc8;
                    }
                    uVar35 = vptestmd_avx512vl(local_b40,local_b40);
                    auVar55 = *(undefined1 (*) [32])(local_bb0.ray + 0x100);
                    auVar79 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar10 = (bool)((byte)uVar35 & 1);
                    auVar80._0_4_ = (uint)bVar10 * auVar79._0_4_ | (uint)!bVar10 * auVar55._0_4_;
                    bVar10 = (bool)((byte)(uVar35 >> 1) & 1);
                    auVar80._4_4_ = (uint)bVar10 * auVar79._4_4_ | (uint)!bVar10 * auVar55._4_4_;
                    bVar10 = (bool)((byte)(uVar35 >> 2) & 1);
                    auVar80._8_4_ = (uint)bVar10 * auVar79._8_4_ | (uint)!bVar10 * auVar55._8_4_;
                    bVar10 = (bool)((byte)(uVar35 >> 3) & 1);
                    auVar80._12_4_ = (uint)bVar10 * auVar79._12_4_ | (uint)!bVar10 * auVar55._12_4_;
                    bVar10 = (bool)((byte)(uVar35 >> 4) & 1);
                    auVar80._16_4_ = (uint)bVar10 * auVar79._16_4_ | (uint)!bVar10 * auVar55._16_4_;
                    bVar10 = (bool)((byte)(uVar35 >> 5) & 1);
                    auVar80._20_4_ = (uint)bVar10 * auVar79._20_4_ | (uint)!bVar10 * auVar55._20_4_;
                    bVar10 = (bool)((byte)(uVar35 >> 6) & 1);
                    auVar80._24_4_ = (uint)bVar10 * auVar79._24_4_ | (uint)!bVar10 * auVar55._24_4_;
                    bVar10 = SUB81(uVar35 >> 7,0);
                    auVar80._28_4_ = (uint)bVar10 * auVar79._28_4_ | (uint)!bVar10 * auVar55._28_4_;
                    *(undefined1 (*) [32])(local_bb0.ray + 0x100) = auVar80;
                    if (local_b40 != (undefined1  [32])0x0) goto LAB_01d66b3d;
                  }
                  *(int *)(ray + k * 4 + 0x100) = auVar120._0_4_;
                  uVar35 = local_cd8 & 0x3f;
                  local_cd8 = 0;
                  local_ce8 = local_ce8 ^ 1L << uVar35;
                  for (uVar35 = local_ce8; (uVar35 & 1) == 0;
                      uVar35 = uVar35 >> 1 | 0x8000000000000000) {
                    local_cd8 = local_cd8 + 1;
                  }
                }
              }
            }
          }
        }
        auVar120 = ZEXT1664(local_b00);
        auVar121 = ZEXT1664(local_b10);
        uVar35 = local_ca0;
        fVar87 = local_ad0;
        fVar82 = fStack_acc;
        fVar83 = fStack_ac8;
        fVar84 = fStack_ac4;
        fVar39 = local_ae0;
        fVar85 = fStack_adc;
        fVar86 = fStack_ad8;
        fVar116 = fStack_ad4;
        fVar81 = local_af0;
        fVar117 = fStack_aec;
        fVar118 = fStack_ae8;
        fVar119 = fStack_ae4;
      }
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }